

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

bool operator>(BigNumber *value1,BigNumber *value2)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  BigNumber::m_format(value1);
  BigNumber::m_format(value2);
  puVar1 = (value1->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(value1->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2;
  puVar2 = (value2->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar3 = true;
  uVar4 = (uint)uVar5;
  uVar6 = (uint)((ulong)((long)(value2->super_Polynome).m_coef.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2);
  if (uVar4 <= uVar6) {
    if (uVar4 == uVar6) {
      uVar5 = uVar5 & 0xffffffff;
      do {
        if ((int)uVar5 < 1) break;
        uVar4 = puVar1[uVar5 + 0xffffffffffffffff];
        uVar6 = puVar2[uVar5 + 0xffffffffffffffff];
        if (uVar6 < uVar4) {
          return true;
        }
        uVar5 = uVar5 - 1;
      } while (uVar4 == uVar6);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator > (BigNumber& value1, BigNumber& value2){
    value1.m_format();
    value2.m_format();
    if(value1.m_degre() > value2.m_degre()){
        return true;
    }

    else if(value1.m_degre() == value2.m_degre()){
        for(int i = (int) value1.m_degre() - 1; i >= 0; i--){
            if(value1.m_coef[i] > value2.m_coef[i]){
                return true;
            }
            else if(value1.m_coef[i] != value2.m_coef[i]){
                return false;
            }
        }
    }
    return false;

}